

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator%(sc_signed *u,sc_unsigned *v)

{
  long in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  small_type in_stack_0000000c;
  int in_stack_00000020;
  sc_digit *in_stack_00000028;
  sc_length_param *in_stack_ffffffffffffffc0;
  sc_signed *in_stack_ffffffffffffffe0;
  
  if ((*(int *)(in_RSI + 8) == 0) || (*(int *)(in_RDX + 8) == 0)) {
    div_by_zero<int>(0);
    sc_length_param::sc_length_param(in_stack_ffffffffffffffc0);
    sc_length_param::len((sc_length_param *)&stack0xffffffffffffffe4);
    sc_signed::sc_signed(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
  }
  else {
    mod_signed_friend(in_stack_0000000c,in_stack_00000008,unaff_retaddr,(sc_digit *)in_RDI,
                      (int)((ulong)in_RSI >> 0x20),in_stack_00000020,in_stack_00000028);
  }
  return in_RDI;
}

Assistant:

sc_signed
operator%(const sc_signed& u, const sc_unsigned& v)
{

  if ((u.sgn == SC_ZERO) || (v.sgn == SC_ZERO)) {
    div_by_zero(v.sgn);  // case 1
    return sc_signed();  // case 2
  }

  // other cases
  return mod_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           v.nbits, v.ndigits, v.digit);
}